

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextAutomata.h
# Opt level: O0

uint __thiscall
bwtil::ContextAutomata::optimalK
          (ContextAutomata *this,uint overhead,BackwardIterator *bfr,bool verbose)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  bool bVar5;
  uint uVar6;
  time_t tVar7;
  ostream *poVar8;
  size_type sVar9;
  void *pvVar10;
  ulint uVar11;
  byte in_CL;
  uint uVar12;
  long *in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 in_ZMM1 [64];
  uint _k;
  ulint nr_of_k_1_mers;
  ulint nr_of_k_mers;
  uint log_n;
  ulint bits_per_k_1_mer;
  ulint bits_per_k_mer;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> sample_dynstring;
  PartialSums sample_cumulative_counter;
  uint i;
  ulint pos;
  int last_perc;
  int perc;
  double p;
  ulint nr_of_sampled_blocks;
  ulint sampled_n;
  ulint nr_of_blocks;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampled_text;
  ulint B;
  value_type_conflict1 *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  allocator_type *in_stack_fffffffffffffd38;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *in_stack_fffffffffffffd40;
  size_type in_stack_fffffffffffffd48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  ulint in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  uint local_18c;
  ulint local_188;
  ulint local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea0;
  undefined8 uVar16;
  ContextAutomata *in_stack_fffffffffffffeb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffee8;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *in_stack_fffffffffffffef0;
  PartialSums local_b0;
  undefined1 local_85;
  uint local_84;
  long local_80;
  int local_68;
  int local_64;
  double local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  ulong local_28;
  byte local_19;
  long *local_18;
  uint local_c;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar15 = in_ZMM1._0_16_;
  local_19 = in_CL & 1;
  local_28 = 1000;
  if (*(ulong *)(in_RDI + 0x98) < 1000) {
    local_28 = *(ulong *)(in_RDI + 0x98);
  }
  local_18 = in_RDX;
  local_c = in_ESI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x14b16a);
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  local_48 = *(ulong *)(in_RDI + 0x98) / local_28;
  uVar2 = *(ulong *)(in_RDI + 0x98);
  auVar13._0_8_ = std::log2<unsigned_long>(0x14b1cb);
  auVar13._8_56_ = extraout_var;
  uVar12 = vcvttsd2usi_avx512f(auVar13._0_16_);
  local_50 = uVar2 / uVar12;
  local_58 = local_50 / local_28;
  auVar3 = vcvtusi2sd_avx512f(auVar13._0_16_,local_58);
  auVar15 = vcvtusi2sd_avx512f(auVar15,local_48);
  local_60 = auVar3._0_8_ / auVar15._0_8_;
  local_68 = -1;
  if ((local_19 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"  Sampling text ... ");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  local_80 = *(long *)(in_RDI + 0x98);
  while( true ) {
    local_80 = local_80 + -1;
    bVar4 = (**(code **)(*local_18 + 0x20))();
    uVar6 = (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    if (((bVar4 ^ 0xff) & 1) == 0) break;
    if ((ulong)((*(long *)(in_RDI + 0x98) + -1) - local_80) % local_28 == 0) {
      if ((local_28 <= local_80 + 1U) &&
         ((*(long *)(in_RDI + 0x98) + -1 == local_80 ||
          (bVar5 = flip_coin((ContextAutomata *)
                             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                             (double)in_stack_fffffffffffffd28), bVar5)))) {
        for (local_84 = 0; local_84 < local_28; local_84 = local_84 + 1) {
          local_85 = (**(code **)(*local_18 + 0x18))();
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     in_stack_fffffffffffffd28);
        }
      }
      local_64 = (int)((ulong)(((*(long *)(in_RDI + 0x98) + -1) - local_80) * 100) /
                      *(ulong *)(in_RDI + 0x98));
      if (((local_68 < local_64) && (local_64 % 5 == 0)) && ((local_19 & 1) != 0)) {
        poVar8 = std::operator<<((ostream *)&std::cout,"  ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_64);
        poVar8 = std::operator<<(poVar8,"% done.");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        local_68 = local_64;
      }
    }
    (**(code **)(*local_18 + 0x18))();
  }
  (**(code **)(*local_18 + 0x10))();
  if ((local_19 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n  Sampled text size = ");
    sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_40);
    pvVar10 = (void *)std::ostream::operator<<(poVar8,sVar9);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  }
  PartialSums::PartialSums
            ((PartialSums *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),uVar6,
             in_stack_fffffffffffffd90);
  uVar16 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x14b5bb);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (value_type *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::DynamicString
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd40);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x14b613);
  uVar6 = PartialSums::bitSize(&local_b0);
  uVar11 = DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::bitSize
                     (in_stack_fffffffffffffd40);
  uVar1 = (ulong)uVar6 + 0x160 + uVar11;
  uVar2 = (ulong)(uint)(*(int *)(in_RDI + 0x88) << 3) * 4 + 0xc0;
  auVar14._0_8_ = std::log2<unsigned_long>(0x14b6a5);
  auVar14._8_56_ = extraout_var_00;
  uVar12 = vcvttsd2usi_avx512f(auVar14._0_16_);
  if ((local_19 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"  Extimated number of bits per k-mer: ");
    pvVar10 = (void *)std::ostream::operator<<(poVar8,uVar1);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  }
  if ((local_19 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"  Extimated number of bits per (k-1)-mer: ");
    pvVar10 = (void *)std::ostream::operator<<(poVar8,uVar2);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  }
  local_188 = 1;
  local_18c = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  local_180 = numberOfContexts(in_stack_fffffffffffffeb0,(uint)((ulong)uVar16 >> 0x20),
                               in_stack_fffffffffffffea0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd40);
  if ((local_19 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"  Number of ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
    in_stack_fffffffffffffd80 = std::operator<<(poVar8,"-mers : ");
    in_stack_fffffffffffffd78 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         std::ostream::operator<<(in_stack_fffffffffffffd80,local_180);
    std::ostream::operator<<(in_stack_fffffffffffffd78,std::endl<char,std::char_traits<char>>);
  }
  while( true ) {
    bVar5 = false;
    if (local_18c < uVar12) {
      bVar5 = local_180 * uVar1 + local_188 * uVar2 <=
              (*(long *)(in_RDI + 0x98) * (ulong)local_c) / 100;
    }
    if (!bVar5) break;
    local_18c = local_18c + 1;
    local_188 = local_180;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd78);
    local_180 = numberOfContexts(in_stack_fffffffffffffeb0,(uint)((ulong)uVar16 >> 0x20),
                                 in_stack_fffffffffffffea0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd40);
    if ((local_19 & 1) != 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"  Number of ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_18c);
      in_stack_fffffffffffffd40 =
           (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
           std::operator<<(poVar8,"-mers : ");
      pvVar10 = (void *)std::ostream::operator<<(in_stack_fffffffffffffd40,local_180);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    }
  }
  if (local_18c < 2) {
    local_18c = 1;
  }
  else {
    local_18c = local_18c - 1;
  }
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::~DynamicString
            ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
             CONCAT44(local_18c,in_stack_fffffffffffffd30));
  PartialSums::~PartialSums((PartialSums *)0x14baef);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd40);
  return local_18c;
}

Assistant:

uint optimalK(uint overhead, BackwardIterator * bfr, bool verbose){

		//strategy: sample randomly n/log n characters of the text (in contiguous blocks of size B)
		//and try k=1,... until suitable k is found. There will be at most log_sigma n iterations, so work is linear.

		ulint B = 1000; //number of characters per block

		if(n<B)
			B = n;

		vector<symbol> sampled_text;

		srand(time(NULL));

		ulint nr_of_blocks = n/B;//total number of blocks in the text
		ulint sampled_n = n/(uint)log2(n);//expected size of sampled text
		ulint nr_of_sampled_blocks = sampled_n/B;//expected number of sampled blocks
		double p = (double)nr_of_sampled_blocks/(double)nr_of_blocks;//probability that a block is sampled

		int perc,last_perc=-1;
		if(verbose)
			cout << "  Sampling text ... " << endl;

		ulint pos = n-1;//current position in the text
		while(not bfr->begin()){

			if(((n-1)-pos)%B==0){

				if(pos+1 >= B ){//if there are at least B characters to be sampled

					if((n-1)-pos==0 or flip_coin(p)){//randomly decide if sample the block

						for(uint i=0;i<B;i++)	//sample B characters
							sampled_text.push_back( bfr->read() );

					}

				}

				perc = (100*((n-1)-pos))/n;

				if(perc>last_perc and (perc%5)==0 and verbose){
					cout << "  " << perc << "% done." << endl;
					last_perc=perc;
				}

			}

			bfr->read();//skip character on text
			pos--;

		}

		bfr->rewind();

		if(verbose)
			cout << "\n  Sampled text size = " << sampled_text.size() << endl;

		/*
		 * Extimate number of bits in memory for each context:
		 * O(sigma * log n) bits for each context.
		 *
		 * Structures in memory:
		 *
		 * vector<uint > prefix_nr;
		 * vector<vector<uint> > edges;
		 * CumulativeCounters * counters;
		 * DynamicString ** dynStrings;
		 * ulint * lengths;
		 *
		 */

		PartialSums sample_cumulative_counter = PartialSums(sigma,n);//sample of cumulative counter to extimate its memory consumption
		DynamicString<bitv> sample_dynstring = DynamicString<bitv>(vector<ulint>(sigma,1));

		ulint bits_per_k_mer =
				CHAR_BIT * sizeof(DynamicString<bitv> *) + //pointers to DynamicStrings
				sample_cumulative_counter.bitSize()  + //cumulative counters
				sample_dynstring.bitSize() + //DynamicStrings
				CHAR_BIT*sizeof(vector<uint >) + //vector prefix_nr
				CHAR_BIT*sizeof(uint) + //content of vector prefix_nr
				CHAR_BIT*sizeof(ulint); //lengths

		ulint bits_per_k_1_mer =
				CHAR_BIT*sizeof(vector<uint>) + //vector edges
				CHAR_BIT*sigma*sizeof(uint); //content of vector edges

		uint log_n = log2(n+1);

		if(verbose) cout << "  Extimated number of bits per k-mer: " << bits_per_k_mer << endl;
		if(verbose) cout << "  Extimated number of bits per (k-1)-mer: " << bits_per_k_1_mer << endl;

		ulint nr_of_k_mers;
		ulint nr_of_k_1_mers=1;//number of (k-1)-mers

		// we want the highest k such that nr_of_contexts*bits_per_context <= n * (overhead/100)

		uint _k = 1;//start from k=1.
		nr_of_k_mers=numberOfContexts( _k, sampled_text);

		if(verbose) cout << "  Number of " << _k << "-mers : " << nr_of_k_mers << endl;

		while( _k < log_n and (nr_of_k_mers * bits_per_k_mer + nr_of_k_1_mers * bits_per_k_1_mer <= (n * overhead)/100) ){

			_k++;

			nr_of_k_1_mers = nr_of_k_mers;
			nr_of_k_mers=numberOfContexts( _k, sampled_text);

			if(verbose) cout << "  Number of " << _k << "-mers : " << nr_of_k_mers << endl;

		}

		if(_k > 1)//we found the first _k above the threshold, so decrease _k.
			_k--;
		else
			_k = 1;//minimum k is 1

		return _k;

	}